

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,DirectoryTarget *dt,char *pass,bool check_all,
          bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmGeneratorTarget *this_00;
  DirectoryTarget *this_01;
  cmLocalUnixMakefileGenerator3 *os;
  bool bVar1;
  string *str;
  vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
  *this_02;
  vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
  *this_03;
  ulong uVar2;
  char *comment;
  bool local_3b2;
  bool local_3b1;
  cmAlphaNum local_390;
  cmAlphaNum local_360;
  string local_330;
  cmAlphaNum local_310;
  cmAlphaNum local_2e0;
  string local_2b0;
  string local_290 [8];
  string doc;
  cmAlphaNum local_240;
  undefined1 local_210 [8];
  string subdir;
  Dir *d;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
  *__range1_1;
  string local_1a0;
  cmAlphaNum local_180;
  undefined1 local_150 [8];
  string tname;
  cmLocalUnixMakefileGenerator3 *tlg;
  string local_118;
  reference local_f8;
  Target *t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string makeTarget;
  cmLocalUnixMakefileGenerator3 *lg;
  bool check_relink_local;
  char *pcStack_30;
  bool check_all_local;
  char *pass_local;
  DirectoryTarget *dt_local;
  cmLocalUnixMakefileGenerator3 *rootLG_local;
  ostream *ruleFileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  makeTarget.field_2._8_8_ = dt->LG;
  pcStack_30 = pass;
  pass_local = (char *)dt;
  dt_local = (DirectoryTarget *)rootLG;
  rootLG_local = (cmLocalUnixMakefileGenerator3 *)ruleFileStream;
  ruleFileStream_local = (ostream *)this;
  str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                  ((cmLocalGenerator *)makeTarget.field_2._8_8_);
  cmAlphaNum::cmAlphaNum(&local_90,str);
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)
             &depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,'/');
  cmStrCat<char_const*>
            ((string *)local_60,&local_90,
             (cmAlphaNum *)
             &depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xffffffffffffffd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  this_02 = (vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
             *)(pass_local + 8);
  __end1 = std::
           vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ::begin(this_02);
  t = (Target *)
      std::
      vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
      ::end(this_02);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Target_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>_>
                                *)&t);
    if (!bVar1) {
      this_03 = (vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                 *)(pass_local + 0x20);
      __end1_1 = std::
                 vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                 ::begin(this_03);
      d = (Dir *)std::
                 vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                 ::end(this_03);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Dir_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>_>
                                 *)&d), bVar1) {
        subdir.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Dir_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>_>
             ::operator*(&__end1_1);
        if ((!check_all) || ((((reference)subdir.field_2._8_8_)->ExcludeFromAll & 1U) == 0)) {
          cmAlphaNum::cmAlphaNum(&local_240,(string *)subdir.field_2._8_8_);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&doc.field_2 + 8),'/');
          cmStrCat<char_const*>
                    ((string *)local_210,&local_240,(cmAlphaNum *)((long)&doc.field_2 + 8),
                     &stack0xffffffffffffffd0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1,(value_type *)local_210);
          std::__cxx11::string::~string((string *)local_210);
        }
        __gnu_cxx::
        __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Dir_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>_>
        ::operator++(&__end1_1);
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
      if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,&this->EmptyRuleHackDepends);
      }
      std::__cxx11::string::string(local_290);
      bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)makeTarget.field_2._8_8_);
      if (bVar1) {
        cmAlphaNum::cmAlphaNum(&local_2e0,"The main recursive \"");
        cmAlphaNum::cmAlphaNum(&local_310,pcStack_30);
        cmStrCat<char[10]>(&local_2b0,&local_2e0,&local_310,(char (*) [10])"\" target.");
        std::__cxx11::string::operator=(local_290,(string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_360,"Recursive \"");
        cmAlphaNum::cmAlphaNum(&local_390,pcStack_30);
        cmStrCat<char[20]>(&local_330,&local_360,&local_390,(char (*) [20])"\" directory target.");
        std::__cxx11::string::operator=(local_290,(string *)&local_330);
        std::__cxx11::string::~string((string *)&local_330);
      }
      os = rootLG_local;
      this_01 = dt_local;
      comment = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((cmLocalUnixMakefileGenerator3 *)this_01,(ostream *)os,comment,(string *)local_60,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1,commands,true,false);
      std::__cxx11::string::~string(local_290);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      std::__cxx11::string::~string((string *)local_60);
      return;
    }
    local_f8 = __gnu_cxx::
               __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Target_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>_>
               ::operator*(&__end1);
    tlg._3_1_ = 0;
    if (check_all) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&local_f8->ExcludedFromAllInConfigs);
      local_3b1 = false;
      if (bVar1) goto LAB_0087dd82;
    }
    else {
LAB_0087dd82:
      tlg._3_1_ = check_relink;
      local_3b2 = true;
      if (check_relink) {
        this_00 = local_f8->GT;
        cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_
                  (&local_118,(cmLocalUnixMakefileGenerator3 *)makeTarget.field_2._8_8_);
        local_3b2 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,&local_118);
      }
      local_3b1 = local_3b2;
    }
    if ((tlg._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if (local_3b1 != false) {
      tname.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator(local_f8->GT);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                (&local_1a0,(cmLocalUnixMakefileGenerator3 *)tname.field_2._8_8_,local_f8->GT);
      cmAlphaNum::cmAlphaNum(&local_180,&local_1a0);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1_1,'/');
      cmStrCat<char_const*>
                ((string *)local_150,&local_180,(cmAlphaNum *)&__range1_1,&stack0xffffffffffffffd0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,(value_type *)local_150);
      std::__cxx11::string::~string((string *)local_150);
    }
    __gnu_cxx::
    __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Target_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  DirectoryTarget const& dt, const char* pass, bool check_all,
  bool check_relink, std::vector<std::string> const& commands)
{
  auto* lg = static_cast<cmLocalUnixMakefileGenerator3*>(dt.LG);
  std::string makeTarget =
    cmStrCat(lg->GetCurrentBinaryDirectory(), '/', pass);

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (DirectoryTarget::Target const& t : dt.Targets) {
    // Add this to the list of depends rules in this directory.
    if ((!check_all || t.ExcludedFromAllInConfigs.empty()) &&
        (!check_relink ||
         t.GT->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
      // The target may be from a different directory; use its local gen.
      auto const* tlg = static_cast<cmLocalUnixMakefileGenerator3 const*>(
        t.GT->GetLocalGenerator());
      std::string tname =
        cmStrCat(tlg->GetRelativeTargetDirectory(t.GT), '/', pass);
      depends.push_back(std::move(tname));
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (DirectoryTarget::Dir const& d : dt.Children) {
    if (check_all && d.ExcludeFromAll) {
      continue;
    }
    std::string subdir = cmStrCat(d.Path, '/', pass);
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = cmStrCat("The main recursive \"", pass, "\" target.");
  } else {
    doc = cmStrCat("Recursive \"", pass, "\" directory target.");
  }

  rootLG.WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                       commands, true);
}